

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O2

void __thiscall
so_5::impl::map_based_subscr_storage::storage_t::setup_content
          (storage_t *this,subscr_info_vector_t *info)

{
  pointer psVar1;
  type_info *ptVar2;
  state_t *psVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer psVar5;
  subscr_map_t events;
  value_t local_e8;
  _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  local_b8;
  insert_iterator<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>_>
  local_88;
  value_type local_78;
  
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_88.container =
       (map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
        *)&local_b8;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar1 = (info->
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88.iter._M_node = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  for (psVar5 = (info->
                super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                )._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    iVar4 = (*((psVar5->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
    ptVar2 = (psVar5->m_msg_type)._M_target;
    psVar3 = psVar5->m_state;
    local_e8.m_mbox.m_obj = (psVar5->m_mbox).m_obj;
    if (local_e8.m_mbox.m_obj != (abstract_message_box_t *)0x0) {
      LOCK();
      ((local_e8.m_mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
      super___atomic_base<unsigned_long>._M_i =
           ((local_e8.m_mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
           super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    event_handler_data_t::event_handler_data_t(&local_e8.m_handler,&psVar5->m_handler);
    local_78.first.m_mbox_id = CONCAT44(extraout_var,iVar4);
    local_78.first.m_msg_type._M_target = ptVar2;
    local_78.first.m_state = psVar3;
    value_t::value_t(&local_78.second,&local_e8);
    value_t::~value_t(&local_e8);
    std::
    insert_iterator<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>_>
    ::operator=(&local_88,&local_78);
    value_t::~value_t(&local_78.second);
  }
  std::
  _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  ::swap(&(this->m_events)._M_t,&local_b8);
  std::
  _Rb_tree<so_5::impl::map_based_subscr_storage::storage_t::key_t,_std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>,_std::_Select1st<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  ::~_Rb_tree(&local_b8);
  return;
}

Assistant:

void
storage_t::setup_content(
	subscription_storage_common::subscr_info_vector_t && info )
	{
		using namespace std;
		using namespace subscription_storage_common;

		subscr_map_t events;
		transform( begin(info), end(info),
				inserter( events, events.begin() ),
				[]( const subscr_info_t & i )
				{
					return subscr_map_t::value_type {
							key_t {
								i.m_mbox->id(),
								i.m_msg_type,
								i.m_state
							},
							value_t {
								i.m_mbox,
								i.m_handler
							} };
				} );

		m_events.swap( events );
	}